

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raft_server_req_handlers.cxx
# Opt level: O2

ptr<resp_msg> __thiscall
cornerstone::raft_server::handle_log_sync_req(raft_server *this,req_msg *req)

{
  log_entry *this_00;
  _func_int **pp_Var1;
  long *plVar2;
  buffer *pbVar3;
  long lVar4;
  long in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var5;
  undefined1 auVar6 [16];
  ptr<resp_msg> pVar7;
  int local_4c;
  element_type *local_48 [4];
  undefined4 local_24;
  
  local_48[0] = ((req[3].log_entries_.
                  super__Vector_base<std::shared_ptr<cornerstone::log_entry>,_std::allocator<std::shared_ptr<cornerstone::log_entry>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish)->
                super___shared_ptr<cornerstone::log_entry,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_4c = 0xb;
  local_24 = *(undefined4 *)(in_RDX + 0x14);
  std::make_shared<cornerstone::resp_msg,unsigned_long,cornerstone::msg_type,int&,int>
            ((unsigned_long *)this,(msg_type *)local_48,&local_4c,
             (int *)((long)&(req->super_msg_base).term_ + 4));
  if ((*(long *)(in_RDX + 0x40) - (long)*(undefined8 **)(in_RDX + 0x38) == 0x10) &&
     (this_00 = (log_entry *)**(undefined8 **)(in_RDX + 0x38), this_00->value_type_ == log_pack)) {
    if (*(char *)((long)&req->last_log_idx_ + 2) != '\0') {
      pp_Var1 = req[4].super_msg_base._vptr_msg_base;
      lVar4 = *(long *)(in_RDX + 0x28);
      pbVar3 = log_entry::get_buf(this_00);
      (**(code **)(*pp_Var1 + 0x58))(pp_Var1,lVar4 + 1,pbVar3);
      lVar4 = (**(code **)(*req[4].super_msg_base._vptr_msg_base + 0x10))();
      commit((raft_server *)req,lVar4 - 1);
      pp_Var1 = this->_vptr_raft_server;
      auVar6 = (**(code **)(*req[4].super_msg_base._vptr_msg_base + 0x10))();
      _Var5._M_pi = auVar6._8_8_;
      pp_Var1[4] = auVar6._0_8_;
      *(undefined1 *)(pp_Var1 + 5) = 1;
      goto LAB_00145905;
    }
    plVar2 = (long *)req[4].last_log_term_;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_48,"This server is ready for cluster, ignore the request",
               (allocator<char> *)&local_4c);
    (**(code **)(*plVar2 + 0x18))(plVar2,local_48);
  }
  else {
    plVar2 = (long *)req[4].last_log_term_;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_48,
               "receive an invalid LogSyncRequest as the log entry value doesn\'t meet the requirements"
               ,(allocator<char> *)&local_4c);
    (**(code **)(*plVar2 + 0x18))(plVar2,local_48);
  }
  std::__cxx11::string::~string((string *)local_48);
  _Var5._M_pi = extraout_RDX;
LAB_00145905:
  pVar7.super___shared_ptr<cornerstone::resp_msg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var5._M_pi;
  pVar7.super___shared_ptr<cornerstone::resp_msg,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (ptr<resp_msg>)pVar7.super___shared_ptr<cornerstone::resp_msg,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

ptr<resp_msg> raft_server::handle_log_sync_req(req_msg& req)
{
    std::vector<ptr<log_entry>>& entries = req.log_entries();
    ptr<resp_msg> resp(cs_new<resp_msg>(state_->get_term(), msg_type::sync_log_response, id_, req.get_src()));
    if (entries.size() != 1 || entries[0]->get_val_type() != log_val_type::log_pack)
    {
        l_->info("receive an invalid LogSyncRequest as the log entry value doesn't meet the requirements");
        return resp;
    }

    if (!catching_up_)
    {
        l_->info("This server is ready for cluster, ignore the request");
        return resp;
    }

    log_store_->apply_pack(req.get_last_log_idx() + 1, entries[0]->get_buf());
    commit(log_store_->next_slot() - 1);
    resp->accept(log_store_->next_slot());
    return resp;
}